

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O0

PSNode * __thiscall dg::pta::PointerGraph::create<(dg::pta::PSNodeType)12>(PointerGraph *this)

{
  type pPVar1;
  PSNode **in_RDI;
  vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
  *unaff_retaddr;
  PSNode *n;
  PointerGraph *in_stack_fffffffffffffff0;
  
  pPVar1 = nodeFactory<(dg::pta::PSNodeType)12,,dg::pta::PSNodeRet>(in_stack_fffffffffffffff0);
  std::
  vector<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>,std::allocator<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>>>
  ::emplace_back<dg::pta::PSNode*&>(unaff_retaddr,in_RDI);
  return &pPVar1->super_PSNode;
}

Assistant:

PSNode *create(Args &&...args) {
        PSNode *n = nodeFactory<Type>(std::forward<Args>(args)...);
        nodes.emplace_back(n); // C++17 returns a referece
        assert(n->getID() == nodes.size() - 1);
        return n;
    }